

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

string * __thiscall
soul::Value::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,StringDictionary *dictionary)

{
  DefaultPrinter p;
  DefaultPrinter local_1a8;
  
  local_1a8.super_ValuePrinter.dictionary = (StringDictionary *)0x0;
  local_1a8.super_ValuePrinter._vptr_ValuePrinter = (_func_int **)&PTR__DefaultPrinter_002f5c28;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.out);
  local_1a8.super_ValuePrinter.dictionary = dictionary;
  print(this,&local_1a8.super_ValuePrinter);
  std::__cxx11::stringbuf::str();
  getDescription::DefaultPrinter::~DefaultPrinter(&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getDescription (const StringDictionary* dictionary) const
{
    struct DefaultPrinter  : public ValuePrinter
    {
        void print (std::string_view s) override  { out << s; }
        std::ostringstream out;
    };

    DefaultPrinter p;
    p.dictionary = dictionary;
    print (p);
    return p.out.str();
}